

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O1

void __thiscall
nrg::detail::AsyncQueue<nrg::PrioExecution>::run(AsyncQueue<nrg::PrioExecution> *this)

{
  pointer pQVar1;
  undefined8 uVar2;
  unique_lock<std::mutex> lock;
  QueueElement elem;
  unique_lock<std::mutex> local_68;
  undefined8 local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_68._M_owns = false;
  local_68._M_device = &this->guard_;
  std::unique_lock<std::mutex>::lock(&local_68);
  local_68._M_owns = true;
  while( true ) {
    while (pQVar1 = (this->queue_).c.
                    super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pQVar1 == (this->queue_).c.
                    super__Vector_base<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
      if (this->running_ != true) {
        std::unique_lock<std::mutex>::~unique_lock(&local_68);
        return;
      }
      std::condition_variable::wait((unique_lock *)&this->cond_);
    }
    local_58._0_4_ = pQVar1->prio;
    local_58._4_4_ = pQVar1->id;
    std::function<void_()>::function((function<void_()> *)&local_50,&pQVar1->what);
    std::
    priority_queue<nrg::PrioExecution::QueueElement,_std::vector<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>,_std::greater<nrg::PrioExecution::QueueElement>_>
    ::pop(&this->queue_);
    std::unique_lock<std::mutex>::unlock(&local_68);
    if (local_40 == (code *)0x0) break;
    (*local_38)(&local_50);
    std::unique_lock<std::mutex>::lock(&local_68);
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
  }
  uVar2 = std::__throw_bad_function_call();
  __cxa_end_catch();
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_68);
  _Unwind_Resume(uVar2);
}

Assistant:

void run()
    {
        std::unique_lock<std::mutex> lock(guard_);
        while (true) {
            while (!AsyncStyle::isEmpty(queue_)) {
                typename AsyncStyle::QueueElement elem = std::move(AsyncStyle::top(queue_));
                if (AsyncStyle::isDue(elem)) {
                    AsyncStyle::pop(queue_);

                    lock.unlock();
                    try {
                        AsyncStyle::execute(elem);
                    }
                    catch(typename AsyncStyle::ExceptionType& ex) {
                        onError_(ex);
                    }
                    lock.lock();
                } else {
                    cond_.wait_for(lock, AsyncStyle::whenIsDue(elem),
                        [this](){ return AsyncStyle::isDue(AsyncStyle::top(queue_)); });
                }
            }
            if (!running_) {
                break;
            }
            cond_.wait(lock);
        }
    }